

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_vocab.c
# Opt level: O2

uint32_t HashVocab_id(HashVocab vocab,char *word)

{
  ProbingVocabularyEntry_T *pPVar1;
  uint64_t uVar2;
  ProbingVocabularyEntry_T *pPVar3;
  char cVar4;
  bool bVar5;
  
  uVar2 = hash(word);
  pPVar1 = (vocab->tb).begin_;
  pPVar3 = pPVar1 + uVar2 % (vocab->tb).buckets_;
  cVar4 = '\0';
  while( true ) {
    if (pPVar3->key == kInvalidHash) {
      return 0xffffffff;
    }
    if (pPVar3->key == uVar2) break;
    pPVar3 = pPVar3 + 1;
    if ((pPVar3 == (vocab->tb).end_) &&
       (bVar5 = cVar4 != '\0', pPVar3 = pPVar1, cVar4 = cVar4 + '\x01', bVar5)) {
      return 0xffffffff;
    }
  }
  return pPVar3->value;
}

Assistant:

uint32_t HashVocab_id(const HashVocab vocab, const char* word){
    uint64_t hashed = hash(word);
    //if (hashed == kUnknownHash || hashed == kUnknownCapHash) {
    //    return 0;
    //}
    ProbingVocabularyEntry_T *slot = HashTable_ideal(&vocab->tb, hashed);
    uint8_t check_dead_loop = 0;
    while (1) {
        if (slot->key == kInvalidHash) {
            //printf("hash:%zu\n", hashed);
            //printf("cannot find\n");
            return -1;//cannot find
        }
        if (slot->key == hashed) {
            return slot->value;
        }
        if ((++slot) == vocab->tb.end_) {
            check_dead_loop++;
            if (check_dead_loop >= 2) {
                //printf("hash:%zu\n", hashed);
                //printf("cannot find dead loop\n");
                return -1;
            }
            slot = vocab->tb.begin_;
        }
    }
    return -1;
}